

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufile_mput.c
# Opt level: O0

ufile_error
ufile_multiple_upload_init(ufile_mutipart_state *self,char *bucket_name,char *key,char *mime_type)

{
  uint uVar1;
  int iVar2;
  cJSON *item_00;
  char *pcVar3;
  list_node *node_00;
  curls_list *pcVar4;
  etag_slist *peVar5;
  ufile_error uVar6;
  list_node *node;
  cJSON *item;
  cJSON *json;
  char local_498 [8];
  char tmp [1024];
  http_body response_body;
  undefined1 local_68 [8];
  http_options opt;
  CURL *curl;
  char *mime_type_local;
  char *key_local;
  char *bucket_name_local;
  ufile_mutipart_state *self_local;
  ufile_error error;
  
  uVar6 = check_bucket_key(bucket_name,key);
  error._0_8_ = uVar6.message;
  uVar1 = uVar6.code;
  self_local = (ufile_mutipart_state *)(ulong)uVar1;
  if ((uVar1 == 0) || ((int)uVar1 / 100 == 2)) {
    opt.header = (curl_slist *)curl_easy_init();
    if (opt.header == (curl_slist *)0x0) {
      self_local = (ufile_mutipart_state *)0xffffffec;
      error._0_8_ = anon_var_dwarf_5e6;
    }
    else {
      memset(local_68,0,0x18);
      uVar6 = set_http_options((http_options *)local_68,"POST",mime_type,bucket_name,key,"uploads");
      error._0_8_ = uVar6.message;
      uVar1 = uVar6.code;
      self_local = (ufile_mutipart_state *)(ulong)uVar1;
      if ((uVar1 == 0) || ((int)uVar1 / 100 == 2)) {
        set_curl_options(opt.header,(http_options *)local_68);
        memset(tmp + 0x3f8,0,0x20);
        memset(local_498,0,0x400);
        curl_easy_setopt(opt.header,0x4e2b,http_write_cb);
        curl_easy_setopt(opt.header,0x2711,tmp + 0x3f8);
        uVar6 = curl_do(opt.header);
        error._0_8_ = uVar6.message;
        uVar1 = uVar6.code;
        self_local = (ufile_mutipart_state *)(ulong)uVar1;
        if ((uVar1 == 0) || ((int)uVar1 / 100 == 2)) {
          item_00 = cJSON_Parse(local_498);
          if (item_00 == (cJSON *)0x0) {
            self_local = (ufile_mutipart_state *)0xfffffffd;
            error._0_8_ = cJSON_GetErrorPtr();
            http_cleanup(opt.header,(http_options *)local_68);
          }
          else {
            http_cleanup((CURL *)0x0,(http_options *)local_68);
            for (node = (list_node *)item_00->child; node != (list_node *)0x0; node = node->next) {
              iVar2 = strcmp((char *)node[3].curl,"BlkSize");
              if (iVar2 == 0) {
                self->part_size = (long)*(int *)&node[2].curl;
              }
              else {
                iVar2 = strcmp((char *)node[3].curl,"UploadId");
                if (iVar2 == 0) {
                  pcVar3 = ufile_strconcat((char *)node[2].next,0);
                  self->upload_id = pcVar3;
                }
              }
            }
            cJSON_Delete(item_00);
            node_00 = (list_node *)malloc(0x10);
            node_00->curl = opt.header;
            node_00->next = (list_node *)0x0;
            pcVar4 = save_curl_handle((curls_list *)0x0,node_00);
            self->curls = pcVar4;
            pcVar3 = ufile_strconcat(bucket_name,0);
            self->bucket_name = pcVar3;
            pcVar3 = ufile_strconcat(key,0);
            self->key = pcVar3;
            pcVar3 = ufile_strconcat(mime_type,0);
            self->mime_type = pcVar3;
            peVar5 = (etag_slist *)malloc(0x40);
            self->etags = peVar5;
            self->etags->cap = 0;
            self->etags->pos = 0;
            self->etags->etag_buf = (char *)0x0;
            pthread_mutex_init((pthread_mutex_t *)&self->etags->mutex,(pthread_mutexattr_t *)0x0);
          }
        }
        else {
          http_cleanup(opt.header,(http_options *)local_68);
        }
      }
      else {
        http_cleanup(opt.header,(http_options *)local_68);
      }
    }
  }
  uVar6.message = (char *)error._0_8_;
  uVar6._0_8_ = self_local;
  return uVar6;
}

Assistant:

struct ufile_error
ufile_multiple_upload_init(struct ufile_mutipart_state *self, const char *bucket_name, const char *key, const char* mime_type){
    struct ufile_error error;
    error = check_bucket_key(bucket_name, key);
    if(UFILE_HAS_ERROR(error.code)){
        return error;
    }
    CURL *curl = curl_easy_init();
    if(curl == NULL){
        error.code = CURL_ERROR_CODE;
        error.message = CURL_INIT_ERROR_MSG;
        return error;
    }

    struct http_options opt;
    memset(&opt, 0, sizeof(struct http_options));
    error = set_http_options(&opt, "POST", mime_type, bucket_name, key, "uploads");
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt);
        return error;
    }

    set_curl_options(curl, &opt);

    struct http_body response_body;
    memset(&response_body, 0, sizeof(struct http_body));
    char tmp[1024] = {0};
    response_body.buffer = tmp;
    response_body.buffer_size = 1024;
    response_body.pos_n = 0;
    curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, http_write_cb);
    curl_easy_setopt(curl, CURLOPT_WRITEDATA, &response_body);

    error = curl_do(curl);
    if(UFILE_HAS_ERROR(error.code)){
        http_cleanup(curl, &opt); //清理 curl，因为没有后续操作。
        return error;
    }
    struct cJSON *json=cJSON_Parse(tmp);
    if(json==NULL){
        error.code = UFILE_MULTIPLE_INIT_ERROR_CODE;
        error.message = cJSON_GetErrorPtr();
        http_cleanup(curl, &opt); //清理 curl，因为没有后续操作。
        return error;
    }
    http_cleanup(NULL, &opt); //curl 不清理，留着后续复用。
    struct cJSON *item = json->child;
    while(item!=NULL){
        if (strcmp(item->string, "BlkSize") == 0){
            self->part_size = item->valueint;
        }else if(strcmp(item->string, "UploadId") == 0){
            self->upload_id = ufile_strconcat(item->valuestring, NULL);
        }
        item=item->next;
    }
    cJSON_Delete(json);

    struct list_node *node = malloc(sizeof(struct list_node));
    node->curl = curl;
    node->next = NULL;
    self->curls = save_curl_handle(NULL, node);

    self->bucket_name = ufile_strconcat(bucket_name, NULL);
    self->key = ufile_strconcat(key, NULL);
    self->mime_type = ufile_strconcat(mime_type, NULL);

    self->etags = malloc(sizeof(struct etag_slist));
    self->etags->cap = 0;
    self->etags->pos = 0;
    self->etags->etag_buf = NULL;
    pthread_mutex_init(&self->etags->mutex, NULL);
    return error;
}